

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegen.cpp
# Opt level: O0

bool FilesAreDifferent(path *a,path *b)

{
  byte bVar1;
  bool bVar2;
  path *p;
  path *ppVar3;
  string l2;
  string l1;
  ifstream bs;
  ifstream as;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  undefined2 in_stack_fffffffffffffb70;
  byte in_stack_fffffffffffffb72;
  byte in_stack_fffffffffffffb73;
  byte in_stack_fffffffffffffb74;
  byte in_stack_fffffffffffffb75;
  byte bVar4;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  string local_478 [32];
  string local_458 [48];
  istream local_428;
  istream local_220;
  byte local_1;
  
  p = (path *)boost::filesystem::file_size((path *)0x16c8b4);
  ppVar3 = (path *)boost::filesystem::file_size((path *)0x16c8c6);
  if (p == ppVar3) {
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),p);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),p);
    std::__cxx11::string::string(local_458);
    std::__cxx11::string::string(local_478);
    do {
      bVar1 = std::ios::good();
      bVar4 = 0;
      if ((bVar1 & 1) != 0) {
        in_stack_fffffffffffffb75 = std::ios::good();
        bVar4 = in_stack_fffffffffffffb75;
      }
      if ((bVar4 & 1) == 0) {
        in_stack_fffffffffffffb74 = std::ios::eof();
        in_stack_fffffffffffffb73 = 0;
        if ((in_stack_fffffffffffffb74 & 1) != 0) {
          in_stack_fffffffffffffb72 = std::ios::eof();
          in_stack_fffffffffffffb73 = in_stack_fffffffffffffb72;
        }
        local_1 = (in_stack_fffffffffffffb73 ^ 0xff) & 1;
        goto LAB_0016ca7f;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_220,local_458);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(&local_428,local_478);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(bVar1,CONCAT16(bVar4,CONCAT15(in_stack_fffffffffffffb75,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffb74,
                                                  CONCAT13(in_stack_fffffffffffffb73,
                                                           CONCAT12(in_stack_fffffffffffffb72,
                                                                    in_stack_fffffffffffffb70)))))),
                              in_stack_fffffffffffffb68);
    } while (!bVar2);
    local_1 = 1;
LAB_0016ca7f:
    std::__cxx11::string::~string(local_478);
    std::__cxx11::string::~string(local_458);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)
               CONCAT17(bVar1,CONCAT16(bVar4,CONCAT15(in_stack_fffffffffffffb75,
                                                      CONCAT14(in_stack_fffffffffffffb74,
                                                               CONCAT13(in_stack_fffffffffffffb73,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffb72,
                                                  in_stack_fffffffffffffb70)))))));
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)
               CONCAT17(bVar1,CONCAT16(bVar4,CONCAT15(in_stack_fffffffffffffb75,
                                                      CONCAT14(in_stack_fffffffffffffb74,
                                                               CONCAT13(in_stack_fffffffffffffb73,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffb72,
                                                  in_stack_fffffffffffffb70)))))));
  }
  else {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool FilesAreDifferent(const filesystem::path &a, const filesystem::path &b) {
    if (filesystem::file_size(a) != filesystem::file_size(b)) {
        return true;
    }
    streams::ifstream as(a), bs(b);
    std::string l1, l2;
    while (as.good() && bs.good()) {
        getline(as, l1);
        getline(bs, l2);
        if (l1 != l2) {
            return true;
        }
    }
    return !(as.eof() && bs.eof());
}